

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O2

int op_http_conn_read_ahead
              (OpusHTTPStream *_stream,OpusHTTPConn *_conn,int _just_read_ahead,opus_int64 _target)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  opus_int64 oVar8;
  int in_R8D;
  opus_int64 oVar9;
  opus_int64 oVar10;
  
  oVar10 = _conn->pos;
  lVar7 = _conn->end_pos;
  lVar1 = _conn->next_pos;
  oVar8 = _conn->next_end;
  if (_just_read_ahead == 0) {
    _conn->next_pos = -1;
    uVar4 = 0x8000;
    iVar3 = op_http_conn_send_request(_stream,_conn,_target,0x8000,in_R8D);
    if (iVar3 < 0) {
      return iVar3;
    }
  }
  else {
    uVar4 = CONCAT71((int7)((ulong)_target >> 8),_target < lVar7 || lVar7 < 0);
    lVar6 = _target;
    if (_target < lVar7 || lVar7 < 0) goto LAB_0010deb0;
  }
  lVar6 = lVar7;
  if (-1 < lVar1) {
    while (lVar6 = lVar7 - oVar10, lVar6 != 0 && oVar10 <= lVar7) {
      iVar3 = (_stream->response).cbuf;
      iVar5 = (int)lVar6;
      if (iVar3 <= lVar6) {
        iVar5 = iVar3;
      }
      uVar2 = op_http_conn_read(_conn,(_stream->response).buf,iVar5,(int)uVar4);
      uVar4 = (ulong)uVar2;
      oVar10 = oVar10 + uVar4;
      if ((int)uVar2 < 1) {
        return -1;
      }
    }
    if (_just_read_ahead == 0) {
      oVar9 = _conn->next_end;
      _conn->next_pos = lVar1;
      _conn->next_end = oVar8;
    }
    else {
      oVar9 = -1;
      oVar8 = _target;
      _target = oVar9;
    }
    iVar3 = op_http_conn_handle_response(_stream,_conn);
    if (iVar3 != 0) {
      return -1;
    }
    _conn->next_pos = _target;
    _conn->next_end = oVar9;
    lVar6 = oVar8;
  }
LAB_0010deb0:
  do {
    lVar7 = lVar6 - oVar10;
    if (lVar7 == 0 || lVar6 < oVar10) {
      if (_just_read_ahead == 0) {
        iVar3 = op_http_conn_handle_response(_stream,_conn);
        if (iVar3 != 0) {
          return -1;
        }
      }
      else {
        _conn->pos = lVar6;
      }
      return 0;
    }
    iVar3 = (_stream->response).cbuf;
    iVar5 = (int)lVar7;
    if (iVar3 <= lVar7) {
      iVar5 = iVar3;
    }
    uVar2 = op_http_conn_read(_conn,(_stream->response).buf,iVar5,(int)uVar4);
    uVar4 = (ulong)uVar2;
    oVar10 = oVar10 + uVar4;
  } while (0 < (int)uVar2);
  return -1;
}

Assistant:

static int op_http_conn_read_ahead(OpusHTTPStream *_stream,
 OpusHTTPConn *_conn,int _just_read_ahead,opus_int64 _target){
  opus_int64 pos;
  opus_int64 end_pos;
  opus_int64 next_pos;
  opus_int64 next_end;
  ptrdiff_t  nread;
  int        ret;
  pos=_conn->pos;
  end_pos=_conn->end_pos;
  next_pos=_conn->next_pos;
  next_end=_conn->next_end;
  if(!_just_read_ahead){
    /*We need to issue a new pipelined request.
      This is the only case where we allow more than one outstanding request
       at a time, so we need to reset next_pos (we'll restore it below if we
       did have an outstanding request).*/
    OP_ASSERT(_stream->pipeline);
    _conn->next_pos=-1;
    ret=op_http_conn_send_request(_stream,_conn,_target,
     OP_PIPELINE_CHUNK_SIZE,0);
    if(OP_UNLIKELY(ret<0))return ret;
  }
  /*We can reach the target position by reading forward in the current chunk.*/
  if(_just_read_ahead&&(end_pos<0||_target<end_pos))end_pos=_target;
  else if(next_pos>=0){
    opus_int64 next_next_pos;
    opus_int64 next_next_end;
    /*We already have a request outstanding.
      Finish off the current chunk.*/
    while(pos<end_pos){
      nread=op_http_conn_read(_conn,_stream->response.buf,
       (int)OP_MIN(end_pos-pos,_stream->response.cbuf),1);
      /*We failed to read ahead.*/
      if(nread<=0)return OP_FALSE;
      pos+=nread;
    }
    OP_ASSERT(pos==end_pos);
    if(_just_read_ahead){
      next_next_pos=next_next_end=-1;
      end_pos=_target;
    }
    else{
      OP_ASSERT(_conn->next_pos==_target);
      next_next_pos=_target;
      next_next_end=_conn->next_end;
      _conn->next_pos=next_pos;
      _conn->next_end=next_end;
      end_pos=next_end;
    }
    ret=op_http_conn_handle_response(_stream,_conn);
    if(OP_UNLIKELY(ret!=0))return OP_FALSE;
    _conn->next_pos=next_next_pos;
    _conn->next_end=next_next_end;
  }
  while(pos<end_pos){
    nread=op_http_conn_read(_conn,_stream->response.buf,
     (int)OP_MIN(end_pos-pos,_stream->response.cbuf),1);
    /*We failed to read ahead.*/
    if(nread<=0)return OP_FALSE;
    pos+=nread;
  }
  OP_ASSERT(pos==end_pos);
  if(!_just_read_ahead){
    ret=op_http_conn_handle_response(_stream,_conn);
    if(OP_UNLIKELY(ret!=0))return OP_FALSE;
  }
  else _conn->pos=end_pos;
  OP_ASSERT(_conn->pos==_target);
  return 0;
}